

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestCaseForTestResult
               (ostream *stream,TestResult *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TimeInMillis ms;
  TimeInMillis ms_00;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase",0xd);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testcase","");
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
  paVar3 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  OutputXmlAttribute(stream,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testcase","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"status","");
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"run","");
  OutputXmlAttribute(stream,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testcase","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"result","");
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"completed","");
  OutputXmlAttribute(stream,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testcase","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"classname","");
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  OutputXmlAttribute(stream,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testcase","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_88,(internal *)result->elapsed_time_,ms);
  OutputXmlAttribute(stream,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testcase","");
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"timestamp","");
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_88,(internal *)result->start_timestamp_,ms_00);
  OutputXmlAttribute(stream,&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  OutputXmlTestResult(stream,result);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestCaseForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test case with a single test.
  *stream << "    <testcase";
  OutputXmlAttribute(stream, "testcase", "name", "");
  OutputXmlAttribute(stream, "testcase", "status", "run");
  OutputXmlAttribute(stream, "testcase", "result", "completed");
  OutputXmlAttribute(stream, "testcase", "classname", "");
  OutputXmlAttribute(stream, "testcase", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testcase", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));

  // Output the actual test result.
  OutputXmlTestResult(stream, result);
}